

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

ExpressionValue * __thiscall
ExpressionValue::operator>>
          (ExpressionValue *__return_storage_ptr__,ExpressionValue *this,ExpressionValue *other)

{
  ExpressionValue *result;
  
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  if ((this->type << 2 | other->type) == 5) {
    __return_storage_ptr__->type = Integer;
    (__return_storage_ptr__->field_1).intValue =
         (ulong)(this->field_1).intValue >> (*(byte *)&other->field_1 & 0x3f);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionValue::operator>>(const ExpressionValue& other) const
{
	ExpressionValue result;
	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		result.type = ExpressionValueType::Integer;
		result.intValue = ((uint64_t) intValue) >> other.intValue;
		break;
	default:
		break;
	}

	return result;
}